

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepEdgeIntegrationPoints.h
# Opt level: O2

pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
* anurbs::BrepEdgeIntegrationPoints::get
            (pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
             *__return_storage_ptr__,BrepEdge *edge,double tolerance,double tessellation_tolerance)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  long lVar3;
  size_type __n;
  pointer ptVar4;
  pointer ptVar5;
  initializer_list<long> __l;
  IntegrationPointList<1> points;
  vector<double,_std::allocator<double>_> spans_on_curve_b;
  Vector point;
  Pointer<CurveOnSurface<3>_> curve_3d_b;
  double t_b;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  Pointer<CurveOnSurface<3>_> curve_3d_a;
  __shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  IntegrationPointList<1> integration_points_b;
  IntegrationPointList<1> integration_points_a;
  double t_a;
  double weight;
  __shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_168 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<anurbs::CurveBase<3l>,(__gnu_cxx::_Lock_policy)2> local_148 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  Interval local_138;
  PointOnCurveProjection<3L> projection_a;
  PointOnCurveProjection<3L> projection_b;
  
  integration_points_a.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  integration_points_a.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  integration_points_a.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  integration_points_b.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  integration_points_b.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  integration_points_b.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)
             &projection_a,
             (__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)
             (edge->m_trims).
             super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  Ref<anurbs::BrepTrim>::operator*((Ref<anurbs::BrepTrim> *)&projection_a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &projection_a.m_tessellation.first.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)
             &projection_a,
             (__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)
             ((edge->m_trims).
              super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1));
  Ref<anurbs::BrepTrim>::operator*((Ref<anurbs::BrepTrim> *)&projection_a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &projection_a.m_tessellation.first.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  BrepTrim::curve_3d((BrepTrim *)&curve_3d_a);
  BrepTrim::curve_3d((BrepTrim *)&curve_3d_b);
  std::__shared_ptr<anurbs::CurveBase<3l>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<anurbs::CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>,void>
            (local_148,
             &curve_3d_a.
              super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
            );
  PointOnCurveProjection<3L>::PointOnCurveProjection
            (&projection_a,(Pointer<CurveBaseD>_conflict *)local_148,tolerance,
             tessellation_tolerance);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140);
  std::__shared_ptr<anurbs::CurveBase<3l>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<anurbs::CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>,void>
            ((__shared_ptr<anurbs::CurveBase<3l>,(__gnu_cxx::_Lock_policy)2> *)(local_168 + 0x10),
             &curve_3d_b.
              super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
            );
  PointOnCurveProjection<3L>::PointOnCurveProjection
            (&projection_b,(Pointer<CurveBaseD>_conflict *)(local_168 + 0x10),tolerance,
             tessellation_tolerance);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150);
  spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (*((curve_3d_b.
      super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_CurveBase<3L>)._vptr_CurveBase[4])(&points);
  ptVar5 = points.
           super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar4 = points.
                super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar5; ptVar4 = ptVar4 + 1) {
    point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
         (ptVar4->super__Tuple_impl<0UL,_double,_double>).super__Tuple_impl<1UL,_double>.
         super__Head_base<1UL,_double,_false>._M_head_impl;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&spans_on_curve_b,(double *)&point);
  }
  std::_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~_Vector_base
            ((_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&points);
  (*((curve_3d_a.
      super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_CurveBase<3L>)._vptr_CurveBase[4])(&points);
  for (ptVar5 = points.
                super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ptVar5 != points.
                super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
    (*((curve_3d_a.
        super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super_CurveBase<3L>)._vptr_CurveBase[5])
              ((ptVar5->super__Tuple_impl<0UL,_double,_double>).super__Tuple_impl<1UL,_double>.
               super__Head_base<1UL,_double,_false>._M_head_impl,&point);
    PointOnCurveProjection<3L>::compute(&projection_b,&point,0.0);
    t_b = projection_b.m_parameter;
    std::vector<double,std::allocator<double>>::emplace_back<double_const&>
              ((vector<double,std::allocator<double>> *)&spans_on_curve_b,&t_b);
  }
  std::_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~_Vector_base
            ((_Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&points);
  (*((curve_3d_b.
      super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_CurveBase<3L>)._vptr_CurveBase[3])();
  points.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)tessellation_tolerance;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&spans_on_curve_b,(double *)&points);
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  BrepTrim::face((BrepTrim *)&t_b);
  BrepTrim::face((BrepTrim *)local_168);
  std::__shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2> *)&point,
             (__shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2> *)((long)t_b + 0x28));
  std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&points,
               (__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)((long)point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                         m_storage.m_data.array[0] + 0x28));
  std::__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_178,
             (__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2> *)
             &points.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].super__Tuple_impl<0UL,_double,_double>.
              super__Head_base<0UL,_double,_false>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &points.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 1));
  std::__shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2> *)&point,
             (__shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2> *)(local_168._0_8_ + 0x28))
  ;
  std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&points,
               (__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)((long)point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                         m_storage.m_data.array[0] + 0x28));
  std::__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1d8,
             (__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2> *)
             &points.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].super__Tuple_impl<0UL,_double,_double>.
              super__Head_base<0UL,_double,_false>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &points.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 1));
  iVar1 = (*((local_178._M_ptr)->super_SurfaceBase<3L>)._vptr_SurfaceBase[2])();
  points.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar1);
  iVar1 = (*((local_178._M_ptr)->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])();
  points.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*((EntryBase *)&(local_1d8._M_ptr)->super_SurfaceBase<3L>)->_vptr_EntryBase[2])();
  points.
  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_01,iVar1);
  (*((EntryBase *)&(local_1d8._M_ptr)->super_SurfaceBase<3L>)->_vptr_EntryBase[3])();
  __l._M_len = 4;
  __l._M_array = (iterator)&points;
  lVar2 = std::max<long>(__l);
  __n = (lVar2 + 2) *
        (((long)spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1);
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::reserve
            (&integration_points_a,__n);
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::reserve
            (&integration_points_b,__n);
  lVar3 = 1;
  while( true ) {
    if ((long)spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 <= lVar3) break;
    local_138.m_t0 =
         spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3 + -1];
    local_138.m_t1 =
         (spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start + lVar3 + -1)[1];
    if (1e-07 <= ABS(local_138.m_t1 - local_138.m_t0)) {
      IntegrationPoints::get(&points,lVar2 + 1,&local_138);
      ptVar5 = points.
               super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ptVar4 = points.
                    super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar5; ptVar4 = ptVar4 + 1
          ) {
        (*((curve_3d_b.
            super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->super_CurveBase<3L>)._vptr_CurveBase[6])
                  ((ptVar4->super__Tuple_impl<0UL,_double,_double>).
                   super__Head_base<0UL,_double,_false>._M_head_impl,
                   (_Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                    *)&point,
                   curve_3d_b.
                   super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,1);
        weight = SQRT(*(double *)
                       ((long)point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                              m_storage.m_data.array[0] + 0x28) *
                      *(double *)
                       ((long)point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                              m_storage.m_data.array[0] + 0x28) +
                      *(double *)
                       ((long)point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                              m_storage.m_data.array[0] + 0x20) *
                      *(double *)
                       ((long)point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                              m_storage.m_data.array[0] + 0x20) +
                      *(double *)
                       ((long)point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                              m_storage.m_data.array[0] + 0x18) *
                      *(double *)
                       ((long)point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                              m_storage.m_data.array[0] + 0x18)) *
                 (ptVar4->super__Tuple_impl<0UL,_double,_double>).super__Tuple_impl<1UL,_double>.
                 super__Head_base<1UL,_double,_false>._M_head_impl;
        std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>::
        emplace_back<double_const&,double_const&>
                  ((vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>> *)
                   &integration_points_b,
                   &(ptVar4->super__Tuple_impl<0UL,_double,_double>).
                    super__Head_base<0UL,_double,_false>._M_head_impl,&weight);
        PointOnCurveProjection<3L>::compute
                  (&projection_a,
                   (Vector *)
                   point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                   m_data.array[0],0.0);
        t_a = projection_a.m_parameter;
        std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>::
        emplace_back<double_const&,double_const&>
                  ((vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>> *)
                   &integration_points_a,&t_a,&weight);
        std::
        _Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
        ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                         *)&point);
      }
      std::_Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::
      ~_Vector_base(&points.
                     super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                   );
    }
    lVar3 = lVar3 + 1;
  }
  std::
  pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
  ::
  pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_&,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_&,_true>
            (__return_storage_ptr__,&integration_points_a,&integration_points_b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>);
  PointOnCurveProjection<3L>::~PointOnCurveProjection(&projection_b);
  PointOnCurveProjection<3L>::~PointOnCurveProjection(&projection_a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&curve_3d_b.
              super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&curve_3d_a.
              super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::_Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::
  ~_Vector_base(&integration_points_b.
                 super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
               );
  std::_Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::
  ~_Vector_base(&integration_points_a.
                 super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
               );
  return __return_storage_ptr__;
}

Assistant:

static std::pair<IntegrationPointList<1>, IntegrationPointList<1>> get(const BrepEdge& edge, const double tolerance, const double tessellation_tolerance)
    {
        IntegrationPointList<1> integration_points_a;
        IntegrationPointList<1> integration_points_b;

        // FIXME: check nb_trims == 2

        const auto& trim_a = *edge.trim(0);
        const auto& trim_b = *edge.trim(1);

        const auto curve_3d_a = trim_a.curve_3d();
        const auto curve_3d_b = trim_b.curve_3d();

        PointOnCurveProjection<3> projection_a(curve_3d_a, tolerance, tessellation_tolerance);
        PointOnCurveProjection<3> projection_b(curve_3d_b, tolerance, tessellation_tolerance);

        std::vector<double> spans_on_curve_b;

        for (const auto span_b : curve_3d_b->spans()) {
            spans_on_curve_b.emplace_back(span_b.t0());
        }

        for (const auto span_a : curve_3d_a->spans()) {
            const double t_a = span_a.t0();

            const Vector point = curve_3d_a->point_at(t_a);

            projection_b.compute(point);

            const double t_b = projection_b.parameter();

            spans_on_curve_b.emplace_back(t_b);
        }

        spans_on_curve_b.emplace_back(curve_3d_b->domain().t1());

        std::sort(spans_on_curve_b.begin(), spans_on_curve_b.end());

        const auto& face_a = trim_a.face();
        const auto& face_b = trim_b.face();

        const auto& surface_3d_a = face_a->surface_geometry().data();
        const auto& surface_3d_b = face_b->surface_geometry().data();

        const auto degree = std::max({surface_3d_a->degree_u(),
                                surface_3d_a->degree_v(), surface_3d_b->degree_u(),
                                surface_3d_b->degree_v()})
            + 1;

        const auto nb_integration_points = (length(spans_on_curve_b) - 1) * (degree + 1);

        integration_points_a.reserve(nb_integration_points);
        integration_points_b.reserve(nb_integration_points);

        for (Index i = 1; i < length(spans_on_curve_b); i++) {
            const auto t0_b = spans_on_curve_b[i - 1];
            const auto t1_b = spans_on_curve_b[i];

            const Interval span_b(t0_b, t1_b);

            if (span_b.length() < 1e-7) {
                continue;
            }

            const auto points = IntegrationPoints::get(degree, span_b);

            for (const auto& [t_b, weight_b] : points) {
                const auto ders = curve_3d_b->derivatives_at(t_b, 1);

                const auto tangent = ders[1];
                const auto weight = weight_b * norm(tangent);

                integration_points_b.emplace_back(t_b, weight);

                projection_a.compute(ders[0]);

                const auto t_a = projection_a.parameter();

                integration_points_a.emplace_back(t_a, weight);
            }
        }

        return {integration_points_a, integration_points_b};
    }